

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.c
# Opt level: O2

err_t DummySkip(void *p,intptr_t *Skip)

{
  err_t eVar1;
  ulong uVar2;
  ulong uVar3;
  size_t Readed;
  uint8_t Buf [1024];
  
  uVar3 = *Skip;
  eVar1 = 0;
  while ((0 < (long)uVar3 && (eVar1 == 0))) {
    if (p == (void *)0x0) {
      __assert_fail("(const void*)(p)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/file/streams.c"
                    ,0x14,"err_t DummySkip(void *, intptr_t *)");
    }
    uVar2 = 0x400;
    if (uVar3 < 0x400) {
      uVar2 = uVar3;
    }
    eVar1 = (**(code **)(*(long *)((long)p + 8) + 0x58))(p,Buf,uVar2,&Readed);
    uVar3 = uVar3 - Readed;
  }
  *Skip = uVar3;
  return eVar1;
}

Assistant:

static err_t DummySkip(void* p, intptr_t* Skip)
{
    uint8_t Buf[1024];
    size_t Readed;
    intptr_t n = *Skip;
    err_t Err = ERR_NONE;
    while (n>0 && Err == ERR_NONE)
    {
        Err = Stream_Read(p,Buf,MIN(n,(intptr_t)sizeof(Buf)),&Readed);
        n -= Readed;
    }
    *Skip = n;
    return Err;
}